

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O1

TIFFReadDirEntryErr TIFFReadDirEntrySshort(TIFF *tif,TIFFDirEntry *direntry,int16_t *value)

{
  uint uVar1;
  TIFFReadDirEntryErr TVar2;
  ulong in_RAX;
  bool bVar3;
  int32_t m;
  undefined8 local_18;
  
  if (direntry->tdir_count != 1) {
    return TIFFReadDirEntryErrCount;
  }
  TVar2 = TIFFReadDirEntryErrType;
  local_18._4_4_ = (undefined4)(in_RAX >> 0x20);
  local_18 = in_RAX;
  switch(direntry->tdir_type) {
  case 1:
    uVar1 = (uint)*(byte *)&direntry->tdir_offset;
    break;
  default:
    goto switchD_0029992e_caseD_2;
  case 3:
    local_18 = CONCAT62((int6)(in_RAX >> 0x10),(direntry->tdir_offset).toff_short);
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabShort((uint16_t *)&local_18);
    }
    uVar1 = (uint)(ushort)local_18;
    if (((ushort)local_18 >> 0xd & 4) != 0) {
      return (ushort)local_18 >> 0xd & TIFFReadDirEntryErrRange;
    }
    break;
  case 4:
    local_18 = CONCAT44(local_18._4_4_,(direntry->tdir_offset).toff_long);
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabLong((uint32_t *)&local_18);
    }
    bVar3 = 0x7fff < (uint)local_18;
    uVar1 = (uint)local_18;
    if (bVar3) goto LAB_002999f4;
    break;
  case 6:
    uVar1 = (int)*(char *)&direntry->tdir_offset;
    break;
  case 8:
    *value = (direntry->tdir_offset).toff_short;
    if ((tif->tif_flags & 0x80) == 0) {
      return TIFFReadDirEntryErrOk;
    }
    TIFFSwabShort((uint16_t *)value);
    return TIFFReadDirEntryErrOk;
  case 9:
    local_18 = CONCAT44(local_18._4_4_,(direntry->tdir_offset).toff_long);
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabLong((uint32_t *)&local_18);
    }
    bVar3 = (int)(short)local_18 != (uint)local_18;
    uVar1 = (uint)local_18;
    if (bVar3) goto LAB_002999f4;
    break;
  case 0x10:
    TVar2 = TIFFReadDirEntryCheckedLong8(tif,direntry,&local_18);
    if (TVar2 != TIFFReadDirEntryErrOk) {
      return TVar2;
    }
    bVar3 = 0x7fff < local_18;
    if (bVar3) goto LAB_002999f4;
LAB_002999cc:
    *value = (int16_t)local_18;
    goto LAB_00299a03;
  case 0x11:
    TVar2 = TIFFReadDirEntryCheckedSlong8(tif,direntry,&local_18);
    if (TVar2 != TIFFReadDirEntryErrOk) {
      return TVar2;
    }
    bVar3 = (long)(short)local_18 != local_18;
    if (!bVar3) goto LAB_002999cc;
LAB_002999f4:
    TVar2 = (uint)bVar3 << 2;
    goto switchD_0029992e_caseD_2;
  }
  *value = (int16_t)uVar1;
LAB_00299a03:
  TVar2 = TIFFReadDirEntryErrOk;
switchD_0029992e_caseD_2:
  return TVar2;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntrySshort(TIFF *tif, TIFFDirEntry *direntry, int16_t *value)
{
    enum TIFFReadDirEntryErr err;
    if (direntry->tdir_count != 1)
        return (TIFFReadDirEntryErrCount);
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t m;
            TIFFReadDirEntryCheckedByte(tif, direntry, &m);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SBYTE:
        {
            int8_t m;
            TIFFReadDirEntryCheckedSbyte(tif, direntry, &m);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SHORT:
        {
            uint16_t m;
            TIFFReadDirEntryCheckedShort(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeSshortShort(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SSHORT:
            TIFFReadDirEntryCheckedSshort(tif, direntry, value);
            return (TIFFReadDirEntryErrOk);
        case TIFF_LONG:
        {
            uint32_t m;
            TIFFReadDirEntryCheckedLong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeSshortLong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG:
        {
            int32_t m;
            TIFFReadDirEntryCheckedSlong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeSshortSlong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_LONG8:
        {
            uint64_t m;
            err = TIFFReadDirEntryCheckedLong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeSshortLong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG8:
        {
            int64_t m;
            err = TIFFReadDirEntryCheckedSlong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeSshortSlong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        default:
            return (TIFFReadDirEntryErrType);
    }
}